

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::Const::set_width(Const *this,uint32_t target_width)

{
  ulong uVar1;
  VarException *this_00;
  ulong uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Const *local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  string local_48;
  allocator_type local_21;
  
  uVar1 = this->value_;
  if ((this->super_Var).is_signed_ == true) {
    uVar2 = -1L << ((byte)target_width - 1 & 0x3f);
    if (((long)uVar1 < (long)uVar2) || ((long)~uVar2 < (long)uVar1)) {
LAB_001935ab:
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)this->value_;
      format_str.size_ = 0x23;
      format_str.data_ = (char *)0x24;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)target_width;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_48,(detail *)"Unable to set const {0} to width {1}",format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_70;
      local_70 = this;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l,&local_21);
      VarException::VarException(this_00,&local_48,&local_68);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (uVar1 >> ((byte)target_width & 0x3f) != 0 && target_width != 0x40) goto LAB_001935ab;
  (this->super_Var).var_width_ = target_width;
  return;
}

Assistant:

void Const::set_width(uint32_t target_width) {
    if (Const::is_legal(value_, target_width, is_signed()) != Const::ConstantLegal::Legal) {
        throw VarException(::format("Unable to set const {0} to width {1}", value_, target_width),
                           {this});
    }
    var_width_ = target_width;
}